

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O3

void __thiscall HFactor::~HFactor(HFactor *this)

{
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar1;
  pointer pdVar2;
  pointer piVar3;
  pointer pcVar4;
  _Manager_type p_Var5;
  LogData *pLVar6;
  pointer pcVar7;
  
  pdVar2 = (this->rhs_).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->rhs_).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->rhs_).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  pcVar4 = (this->rhs_).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4);
  }
  pdVar2 = (this->rhs_).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->rhs_).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  pdVar2 = (this->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->pf_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  pdVar2 = (this->pf_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->ur_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  pdVar2 = (this->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  pdVar2 = (this->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  pdVar2 = (this->lr_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->lr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->lr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  pdVar2 = (this->l_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->l_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->l_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->l_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->l_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->row_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->row_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->row_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->col_link_last).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->col_link_next).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->col_link_first).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  pdVar2 = (this->mwz_column_array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pcVar4 = (this->mwz_column_mark).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4);
  }
  piVar3 = (this->mwz_column_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->mr_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->mr_count_before).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->mr_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->mr_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->mr_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  pdVar2 = (this->mc_min_pivot).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  pdVar2 = (this->mc_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->mc_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->mc_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->mc_count_n).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->mc_count_a).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->mc_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->mc_var).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->permute).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  pdVar2 = (this->b_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->b_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->b_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->b_var).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  pdVar2 = (this->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar2 != (pointer)0x0) {
    operator_delete(pdVar2);
  }
  piVar3 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  p_Var5 = (this->log_options).user_callback.super__Function_base._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    pfVar1 = &(this->log_options).user_callback;
    (*p_Var5)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
  }
  pLVar6 = (this->log_data)._M_t.
           super___uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>._M_t.
           super__Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>.
           super__Head_base<0UL,_HFactor::LogData_*,_false>._M_head_impl;
  if (pLVar6 != (LogData *)0x0) {
    operator_delete(pLVar6);
  }
  (this->log_data)._M_t.
  super___uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>._M_t.
  super__Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>.
  super__Head_base<0UL,_HFactor::LogData_*,_false>._M_head_impl = (LogData *)0x0;
  pcVar7 = (this->refactor_info_).pivot_type.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar7 != (pointer)0x0) {
    operator_delete(pcVar7);
  }
  piVar3 = (this->refactor_info_).pivot_var.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->refactor_info_).pivot_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->var_with_no_pivot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->col_with_no_pivot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
  }
  piVar3 = (this->row_with_no_pivot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3 != (pointer)0x0) {
    operator_delete(piVar3);
    return;
  }
  return;
}

Assistant:

HFactor()
      : build_realTick(0.0),
        build_synthetic_tick(0.0),
        rank_deficiency(0),
        basis_matrix_num_el(0),
        invert_num_el(0),
        kernel_dim(0),
        kernel_num_el(0),
        num_row(0),
        num_col(0),
        num_basic(0),
        a_matrix_valid(false),
        a_start(nullptr),
        a_index(nullptr),
        a_value(nullptr),
        basic_index(nullptr),
        pivot_threshold(0.0),
        pivot_tolerance(0.0),
        highs_debug_level(0),
        time_limit_(0.0),
        use_original_HFactor_logic(false),
        debug_report_(false),
        basis_matrix_limit_size(0),
        update_method(0),
        build_timer_(nullptr),
        nwork(0),
        u_merit_x(0),
        // clang-format off
        u_total_x(0) {}